

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# String.cpp
# Opt level: O2

String * Corrade::Utility::String::lowercase(String *__return_storage_ptr__,String *string)

{
  Deleter p_Var1;
  BasicStringView<char> local_40;
  String local_30;
  
  if (((string->field_0)._small.size & 0x40) == 0) {
    p_Var1 = Containers::String::deleter(string);
    if (p_Var1 != (Deleter)0x0) {
      Containers::String::String(&local_30,string);
      Containers::String::operator=(string,&local_30);
      Containers::String::~String(&local_30);
    }
  }
  Containers::BasicStringView<char>::BasicStringView(&local_40,string);
  Implementation::lowercaseInPlace();
  Containers::String::String(__return_storage_ptr__,string);
  return __return_storage_ptr__;
}

Assistant:

Containers::String lowercase(Containers::String string) {
    /* In the rare scenario where we'd get a non-owned string (such as
       String::nullTerminatedView() passed right into the function), make it
       owned first. Usually it'll get copied however, which already makes it
       owned. */
    if(!string.isSmall() && string.deleter()) string = Containers::String{string};

    lowercaseInPlace(string);
    return string;
}